

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Publications.cpp
# Opt level: O3

void __thiscall helics::Publication::publish(Publication *this,double *vals,int size)

{
  ValueFederate *pVVar1;
  bool bVar2;
  SmallBuffer db;
  allocator_type local_b1;
  data_view local_b0;
  void *local_90 [2];
  long local_80;
  size_t local_50;
  byte *local_40;
  bool local_38;
  bool local_36;
  
  pVVar1 = this->fed;
  if (this->changeDetectionEnabled == true) {
    bVar2 = changeDetected(&this->prevValue,vals,(long)size,this->delta);
    if (!bVar2) {
      return;
    }
    std::vector<double,std::allocator<double>>::vector<double_const*,void>
              ((vector<double,std::allocator<double>> *)local_90,vals,vals + size,&local_b1);
    std::
    variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
    ::operator=((variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                 *)&this->prevValue,(vector<double,_std::allocator<double>_> *)local_90);
    if (local_90[0] != (void *)0x0) {
      operator_delete(local_90[0],local_80 - (long)local_90[0]);
    }
  }
  if (pVVar1 != (ValueFederate *)0x0) {
    typeConvert((SmallBuffer *)local_90,this->pubType,vals,(long)size);
    local_b0.dblock._M_len = local_50;
    local_b0.dblock._M_str = (char *)local_40;
    local_b0.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_b0.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    helics::ValueFederate::publishBytes(this->fed,this,&local_b0);
    if (local_b0.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b0.ref.
                 super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (((local_36 == true) && (local_38 == false)) && (local_40 != (byte *)0x0)) {
      operator_delete__(local_40);
    }
  }
  return;
}

Assistant:

void Publication::publish(const double* vals, int size)
{
    bool doPublish = (fed != nullptr);
    if (changeDetectionEnabled) {
        if (changeDetected(prevValue, vals, size, delta)) {
            prevValue = std::vector<double>(vals, vals + size);
        } else {
            doPublish = false;
        }
    }
    if (doPublish) {
        auto db = typeConvert(pubType, vals, size);
        fed->publishBytes(*this, db);
    }
}